

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDelegateExpr(BinaryReaderIR *this,Index depth)

{
  pointer pLVar1;
  pointer pLVar2;
  Offset OVar3;
  long lVar4;
  char *pcVar5;
  int *piVar6;
  Enum EVar7;
  Location loc;
  Location local_98;
  Var local_78;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pLVar2 - (long)pLVar1;
  if (lVar4 == 0) {
    piVar6 = (int *)0x0;
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    piVar6 = (int *)((long)pLVar1 + lVar4 + -0x18);
  }
  EVar7 = Error;
  if (pLVar2 == pLVar1) {
    return (Result)Error;
  }
  if (*piVar6 == 6) {
    lVar4 = *(long *)(piVar6 + 4);
    if (*(int *)(lVar4 + 0x38) != 0x3d) {
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x4e,"Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]"
                   );
    }
    if (*(int *)(lVar4 + 0x3c) != 2) {
      if (*(int *)(lVar4 + 0x3c) != 0) {
        pcVar5 = "delegate not allowed in try-catch";
        goto LAB_0011c72a;
      }
      *(undefined4 *)(lVar4 + 0x3c) = 2;
    }
    local_98.field_1.field_0.line = 0;
    local_98.field_1.field_0.first_column = 0;
    local_98.field_1.field_0.last_column = 0;
    local_98.filename._M_len = 0;
    local_98.filename._M_str._0_4_ = 0;
    local_98.filename._M_str._4_4_ = 0;
    pcVar5 = this->filename_;
    local_98.filename._M_len = strlen(pcVar5);
    local_98.filename._M_str._0_4_ = SUB84(pcVar5,0);
    local_98.filename._M_str._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
    OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    local_98.field_1.field_0.line = (int)OVar3;
    local_98.field_1.field_0.first_column = (int)(OVar3 >> 0x20);
    Var::Var(&local_78,depth,&local_98);
    Var::operator=((Var *)(lVar4 + 0x130),&local_78);
    Var::~Var(&local_78);
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar1 != (this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + -1;
      return (Result)Ok;
    }
    pcVar5 = "popping empty label stack";
    EVar7 = Ok;
  }
  else {
    pcVar5 = "delegate not inside try block";
  }
LAB_0011c72a:
  PrintError(this,pcVar5);
  return (Result)EVar7;
}

Assistant:

Result BinaryReaderIR::OnDelegateExpr(Index depth) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("delegate not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Delegate;
  } else if (try_->kind != TryKind::Delegate) {
    PrintError("delegate not allowed in try-catch");
    return Result::Error;
  }

  try_->delegate_target = Var(depth, GetLocation());

  PopLabel();
  return Result::Ok;
}